

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O0

void duckdb::RadixSortLSD
               (BufferManager *buffer_manager,data_ptr_t *dataptr,idx_t *count,idx_t *col_offset,
               idx_t *row_width,idx_t *sorting_size)

{
  void *__dest;
  long lVar1;
  data_ptr_t __src;
  long *in_RCX;
  ulong *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  long *in_R8;
  ulong *in_R9;
  idx_t *radix_offset;
  idx_t i_1;
  data_ptr_t row_ptr;
  idx_t val;
  idx_t max_count;
  idx_t i;
  data_ptr_t offset_ptr;
  idx_t offset;
  data_ptr_t target_ptr;
  data_ptr_t source_ptr;
  idx_t r;
  idx_t counts [256];
  bool swap;
  AllocatedData temp_block;
  size_t in_stack_fffffffffffff710;
  void *in_stack_fffffffffffff718;
  data_ptr_t in_stack_fffffffffffff720;
  Allocator *in_stack_fffffffffffff728;
  data_ptr_t local_8d0;
  ulong local_8b8;
  data_ptr_t local_8b0;
  ulong local_8a8;
  void *local_8a0;
  ulong local_898;
  byte *local_890;
  ulong local_860;
  void *local_858 [257];
  byte local_49;
  AllocatedData local_48;
  ulong *local_30;
  long *local_28;
  long *local_20;
  ulong *local_18;
  undefined8 *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0xa0))();
  Allocator::Allocate(in_stack_fffffffffffff728,(idx_t)in_stack_fffffffffffff720);
  local_49 = 0;
  for (local_860 = 1; local_860 <= *local_30; local_860 = local_860 + 1) {
    memset(local_858,0,0x800);
    if ((local_49 & 1) == 0) {
      local_8d0 = (data_ptr_t)*local_10;
    }
    else {
      local_8d0 = AllocatedData::get(&local_48);
    }
    if ((local_49 & 1) == 0) {
      in_stack_fffffffffffff720 = AllocatedData::get(&local_48);
    }
    lVar1 = (*local_20 + *local_30) - local_860;
    local_890 = local_8d0 + lVar1;
    for (local_898 = 0; local_898 < *local_18; local_898 = local_898 + 1) {
      local_858[*local_890] = (void *)((long)local_858[*local_890] + 1);
      local_890 = local_890 + *local_28;
    }
    local_8a0 = local_858[0];
    for (local_8a8 = 1; local_8a8 < 0x100; local_8a8 = local_8a8 + 1) {
      in_stack_fffffffffffff718 =
           (void *)MaxValue<unsigned_long>
                             ((unsigned_long)local_8a0,(unsigned_long)local_858[local_8a8]);
      local_858[local_8a8] = (void *)((long)local_858[local_8a8] + (long)local_858[local_8a8 - 1]);
      local_8a0 = in_stack_fffffffffffff718;
    }
    if (local_8a0 != (void *)*local_18) {
      local_8b0 = local_8d0 + (*local_18 - 1) * *local_28;
      for (local_8b8 = 0; local_8b8 < *local_18; local_8b8 = local_8b8 + 1) {
        local_858[local_8b0[lVar1]] = (void *)((long)local_858[local_8b0[lVar1]] + -1);
        FastMemcpy(in_stack_fffffffffffff720,in_stack_fffffffffffff718,in_stack_fffffffffffff710);
        local_8b0 = local_8b0 + -*local_28;
      }
      local_49 = (local_49 ^ 0xff) & 1;
    }
  }
  if ((local_49 & 1) != 0) {
    __dest = (void *)*local_10;
    __src = AllocatedData::get(&local_48);
    memcpy(__dest,__src,*local_18 * *local_28);
  }
  AllocatedData::~AllocatedData((AllocatedData *)0x161968e);
  return;
}

Assistant:

void RadixSortLSD(BufferManager &buffer_manager, const data_ptr_t &dataptr, const idx_t &count, const idx_t &col_offset,
                  const idx_t &row_width, const idx_t &sorting_size) {
	auto temp_block = buffer_manager.GetBufferAllocator().Allocate(count * row_width);
	bool swap = false;

	idx_t counts[SortConstants::VALUES_PER_RADIX];
	for (idx_t r = 1; r <= sorting_size; r++) {
		// Init counts to 0
		memset(counts, 0, sizeof(counts));
		// Const some values for convenience
		const data_ptr_t source_ptr = swap ? temp_block.get() : dataptr;
		const data_ptr_t target_ptr = swap ? dataptr : temp_block.get();
		const idx_t offset = col_offset + sorting_size - r;
		// Collect counts
		data_ptr_t offset_ptr = source_ptr + offset;
		for (idx_t i = 0; i < count; i++) {
			counts[*offset_ptr]++;
			offset_ptr += row_width;
		}
		// Compute offsets from counts
		idx_t max_count = counts[0];
		for (idx_t val = 1; val < SortConstants::VALUES_PER_RADIX; val++) {
			max_count = MaxValue<idx_t>(max_count, counts[val]);
			counts[val] = counts[val] + counts[val - 1];
		}
		if (max_count == count) {
			continue;
		}
		// Re-order the data in temporary array
		data_ptr_t row_ptr = source_ptr + (count - 1) * row_width;
		for (idx_t i = 0; i < count; i++) {
			idx_t &radix_offset = --counts[*(row_ptr + offset)];
			FastMemcpy(target_ptr + radix_offset * row_width, row_ptr, row_width);
			row_ptr -= row_width;
		}
		swap = !swap;
	}
	// Move data back to original buffer (if it was swapped)
	if (swap) {
		memcpy(dataptr, temp_block.get(), count * row_width);
	}
}